

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_chroma_copy
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)(wd * 2);
  if (wd * 2 < 1) {
    uVar1 = uVar2;
  }
  uVar3 = (ulong)(uint)ht;
  if (ht < 1) {
    uVar3 = uVar2;
  }
  for (; (int)uVar2 != (int)uVar3; uVar2 = (ulong)((int)uVar2 + 1)) {
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      pu1_dst[uVar4] = pu1_src[uVar4];
    }
    pu1_src = pu1_src + src_strd;
    pu1_dst = pu1_dst + dst_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_copy(UWORD8 *pu1_src,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd,
                                  WORD32 dst_strd,
                                  WORD8 *pi1_coeff,
                                  WORD32 ht,
                                  WORD32 wd)
{
    WORD32 row, col;
    UNUSED(pi1_coeff);
    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            pu1_dst[col] = pu1_src[col];
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }
}